

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O2

void __thiscall QSqlQuery::QSqlQuery(QSqlQuery *this,QSqlResult *result)

{
  QSqlQueryPrivate *this_00;
  
  this_00 = (QSqlQueryPrivate *)operator_new(0x10);
  QSqlQueryPrivate::QSqlQueryPrivate(this_00,result);
  this->d = this_00;
  return;
}

Assistant:

QSqlQuery::QSqlQuery(QSqlResult *result)
{
    d = new QSqlQueryPrivate(result);
}